

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

RefCountedPtr<raptor::Status> __thiscall raptor::MakeStatusFromPosixError(raptor *this,char *api)

{
  int *piVar1;
  char *pcVar2;
  int err;
  char *text;
  int local_2c;
  char *local_28;
  
  piVar1 = __errno_location();
  local_2c = *piVar1;
  local_28 = (char *)0x0;
  pcVar2 = strerror(local_2c);
  raptor_asprintf(&local_28,"%s: %s",api,pcVar2);
  MakeRefCounted<raptor::Status,int&,char*&>(this,&local_2c,&local_28);
  Free(local_28);
  return (RefCountedPtr<raptor::Status>)(Status *)this;
}

Assistant:

RefCountedPtr<Status> MakeStatusFromPosixError(const char* api) {
    int err = errno;
    char* text = nullptr;
    raptor_asprintf(&text, "%s: %s", api, strerror(err));
    RefCountedPtr<Status> obj = MakeRefCounted<Status>(err, text);
    raptor::Free(text);
    return obj;
}